

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtarga.c
# Opt level: O2

void write_header(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,int num_colors)

{
  jpeg_error_mgr *pjVar1;
  size_t sVar2;
  char targaheader [18];
  
  targaheader[0] = '\0';
  targaheader[1] = '\0';
  targaheader[2] = '\0';
  targaheader[3] = '\0';
  targaheader[4] = '\0';
  targaheader[5] = '\0';
  targaheader[6] = '\0';
  targaheader[7] = '\0';
  if (0 < num_colors) {
    targaheader[5] = (char)num_colors;
    targaheader[0] = '\0';
    targaheader[1] = '\x01';
    targaheader[2] = '\0';
    targaheader[3] = '\0';
    targaheader[4] = '\0';
    targaheader[6] = (char)((uint)num_colors >> 8);
    targaheader[7] = '\x18';
  }
  targaheader._8_8_ =
       (ulong)CONCAT13((char)(cinfo->output_height >> 8),
                       CONCAT12((char)cinfo->output_height,(short)cinfo->output_width)) << 0x20;
  if (cinfo->out_color_space == JCS_GRAYSCALE) {
    targaheader[2] = '\x03';
  }
  else {
    if (num_colors < 1) {
      targaheader[2] = '\x02';
      targaheader[0x10] = '\x18';
      targaheader[0x11] = ' ';
      goto LAB_00108e0c;
    }
    targaheader[2] = '\x01';
  }
  targaheader[0x10] = '\b';
  targaheader[0x11] = ' ';
LAB_00108e0c:
  targaheader[0] = (char)targaheader._0_3_;
  targaheader[1] = SUB31(targaheader._0_3_,1);
  targaheader[2] = SUB31(targaheader._0_3_,2);
  sVar2 = fwrite(targaheader,1,0x12,(FILE *)dinfo->output_file);
  if (sVar2 == 0x12) {
    return;
  }
  pjVar1 = cinfo->err;
  pjVar1->msg_code = 0x25;
  (*pjVar1->error_exit)((j_common_ptr)cinfo);
  return;
}

Assistant:

LOCAL(void)
write_header(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo, int num_colors)
/* Create and write a Targa header */
{
  char targaheader[18];

  /* Set unused fields of header to 0 */
  MEMZERO(targaheader, sizeof(targaheader));

  if (num_colors > 0) {
    targaheader[1] = 1;         /* color map type 1 */
    targaheader[5] = (char)(num_colors & 0xFF);
    targaheader[6] = (char)(num_colors >> 8);
    targaheader[7] = 24;        /* 24 bits per cmap entry */
  }

  targaheader[12] = (char)(cinfo->output_width & 0xFF);
  targaheader[13] = (char)(cinfo->output_width >> 8);
  targaheader[14] = (char)(cinfo->output_height & 0xFF);
  targaheader[15] = (char)(cinfo->output_height >> 8);
  targaheader[17] = 0x20;       /* Top-down, non-interlaced */

  if (cinfo->out_color_space == JCS_GRAYSCALE) {
    targaheader[2] = 3;         /* image type = uncompressed grayscale */
    targaheader[16] = 8;        /* bits per pixel */
  } else {                      /* must be RGB */
    if (num_colors > 0) {
      targaheader[2] = 1;       /* image type = colormapped RGB */
      targaheader[16] = 8;
    } else {
      targaheader[2] = 2;       /* image type = uncompressed RGB */
      targaheader[16] = 24;
    }
  }

  if (JFWRITE(dinfo->output_file, targaheader, 18) != (size_t)18)
    ERREXIT(cinfo, JERR_FILE_WRITE);
}